

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

void order_unassigned(sat_solver3 *s,int v)

{
  int iVar1;
  int *piVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  piVar6 = s->orderpos;
  if (piVar6[v] == -1) {
    uVar7 = (s->order).size;
    piVar6[v] = uVar7;
    if (uVar7 == (s->order).cap) {
      iVar8 = (uVar7 >> 1) * 3;
      if ((int)uVar7 < 4) {
        iVar8 = uVar7 * 2;
      }
      piVar6 = (s->order).ptr;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar8 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar8 << 2);
      }
      (s->order).ptr = piVar6;
      if (piVar6 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->order).cap * 9.5367431640625e-07,(double)iVar8 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->order).cap = iVar8;
      uVar7 = (s->order).size;
      piVar6 = s->orderpos;
    }
    piVar2 = (s->order).ptr;
    (s->order).size = uVar7 + 1;
    piVar2[(int)uVar7] = v;
    uVar9 = (ulong)piVar6[v];
    iVar8 = piVar2[uVar9];
    if (uVar9 == 0) {
      uVar7 = 0;
    }
    else {
      if (piVar6[v] == -1) {
        __assert_fail("s->orderpos[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                      ,0x91,"void order_update(sat_solver3 *, int)");
      }
      pwVar3 = s->activity;
      uVar4 = pwVar3[iVar8];
      do {
        uVar5 = (uint)uVar9;
        uVar10 = (int)((uVar5 - ((int)(uVar5 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar2[(int)uVar10];
        uVar7 = uVar5;
        if (uVar4 <= pwVar3[iVar1]) break;
        piVar2[(int)uVar5] = iVar1;
        piVar6[iVar1] = uVar5;
        uVar9 = (ulong)uVar10;
        uVar7 = uVar10;
      } while (2 < uVar5);
    }
    piVar2[(int)uVar7] = iVar8;
    piVar6[iVar8] = uVar7;
  }
  return;
}

Assistant:

static inline void order_unassigned(sat_solver* s, int v) // undoorder
{
    int* orderpos = s->orderpos;
    if (orderpos[v] == -1){
        orderpos[v] = veci_size(&s->order);
        veci_push(&s->order,v);
        order_update(s,v);
//printf( "+%d ", v );
    }
}